

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O0

bool __thiscall apngasm::APNGAsm::saveJSON(APNGAsm *this,string *outputPath,string *imageDir)

{
  ulong uVar1;
  undefined1 local_38 [8];
  SpecWriter writer;
  bool result;
  string *imageDir_local;
  string *outputPath_local;
  APNGAsm *this_local;
  
  writer._pListener._7_1_ = 0;
  uVar1 = (**(code **)(*(long *)this->_listener + 0x30))(this->_listener,outputPath);
  if ((uVar1 & 1) != 0) {
    spec::SpecWriter::SpecWriter((SpecWriter *)local_38,this,this->_listener);
    writer._pListener._7_1_ =
         spec::SpecWriter::writeJSON((SpecWriter *)local_38,outputPath,imageDir);
    if ((bool)writer._pListener._7_1_) {
      (**(code **)(*(long *)this->_listener + 0x38))(this->_listener,outputPath);
    }
  }
  return (bool)(writer._pListener._7_1_ & 1);
}

Assistant:

bool APNGAsm::saveJSON(const std::string& outputPath, const std::string& imageDir) const
  {
    bool result = false;
    if( _listener->onPreSave(outputPath) )
    {
      spec::SpecWriter writer(this, _listener);
      if( (result = writer.writeJSON(outputPath, imageDir)) )
        _listener->onPostSave(outputPath);
    }
    return result;
  }